

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathRect(ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,int rounding_corners)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  ImVec2 *pIVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  int iVar7;
  ImVec2 *pIVar8;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 local_58;
  float local_50;
  float local_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar5 = GImGui;
  uVar2 = ~rounding_corners;
  fVar10 = 0.5;
  if ((uVar2 & 0xc) != 0) {
    fVar10 = 1.0;
  }
  fVar12 = 0.5;
  if ((uVar2 & 3) != 0) {
    fVar12 = fVar10;
  }
  fVar10 = 0.5;
  if ((uVar2 & 6) != 0) {
    fVar10 = 1.0;
  }
  fVar9 = 0.5;
  if ((uVar2 & 9) != 0) {
    fVar9 = fVar10;
  }
  if (rounding_corners != 0) {
    fVar10 = (*a).x;
    fVar11 = (*a).y;
    fVar12 = ABS(b->x - fVar10) * fVar12 + -1.0;
    if (fVar12 <= rounding) {
      rounding = fVar12;
    }
    fVar12 = ABS(b->y - fVar11) * fVar9 + -1.0;
    if (fVar12 <= rounding) {
      rounding = fVar12;
    }
    if (0.0 < rounding) {
      fVar12 = 0.0;
      if ((rounding_corners & 1U) != 0) {
        fVar12 = rounding;
      }
      local_4c = 0.0;
      if ((rounding_corners & 2U) != 0) {
        local_4c = rounding;
      }
      local_48 = 0.0;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      if ((rounding_corners & 4U) != 0) {
        local_48 = rounding;
        uStack_44 = in_XMM0_Db;
        uStack_40 = in_XMM0_Dc;
        uStack_3c = in_XMM0_Dd;
      }
      local_50 = 0.0;
      if ((rounding_corners & 8U) != 0) {
        local_50 = rounding;
      }
      local_58.x = fVar10 + fVar12;
      local_58.y = fVar11 + fVar12;
      PathArcToFast(this,&local_58,fVar12,6,9);
      local_58.y = a->y + local_4c;
      local_58.x = b->x - local_4c;
      PathArcToFast(this,&local_58,local_4c,9,0xc);
      local_58.x = (*b).x - local_48;
      local_58.y = (*b).y - local_48;
      PathArcToFast(this,&local_58,local_48,0,3);
      local_58.y = b->y - local_50;
      local_58.x = a->x + local_50;
      PathArcToFast(this,&local_58,local_50,3,6);
      return;
    }
  }
  iVar3 = (this->_Path).Size;
  if (iVar3 == (this->_Path).Capacity) {
    if (iVar3 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar3 / 2 + iVar3;
    }
    iVar7 = iVar3 + 1;
    if (iVar3 + 1 < iVar6) {
      iVar7 = iVar6;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar4 = (ImVec2 *)(*(pIVar5->IO).MemAllocFn)((long)iVar7 << 3);
    pIVar8 = (this->_Path).Data;
    if (pIVar8 == (ImVec2 *)0x0) {
LAB_0014ded9:
      pIVar8 = (ImVec2 *)0x0;
      pIVar5 = GImGui;
    }
    else {
      memcpy(pIVar4,pIVar8,(long)(this->_Path).Size << 3);
      pIVar5 = GImGui;
      pIVar8 = (this->_Path).Data;
      if (pIVar8 == (ImVec2 *)0x0) goto LAB_0014ded9;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar5->IO).MemFreeFn)(pIVar8);
    (this->_Path).Data = pIVar4;
    (this->_Path).Capacity = iVar7;
    iVar3 = (this->_Path).Size;
  }
  else {
    pIVar4 = (this->_Path).Data;
  }
  (this->_Path).Size = iVar3 + 1;
  pIVar4[iVar3] = *a;
  pIVar5 = GImGui;
  fVar10 = b->x;
  fVar12 = a->y;
  iVar3 = (this->_Path).Size;
  if (iVar3 == (this->_Path).Capacity) {
    if (iVar3 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar3 / 2 + iVar3;
    }
    iVar7 = iVar3 + 1;
    if (iVar3 + 1 < iVar6) {
      iVar7 = iVar6;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    local_48 = fVar10;
    pIVar4 = (ImVec2 *)(*(pIVar5->IO).MemAllocFn)((long)iVar7 << 3);
    pIVar8 = (this->_Path).Data;
    if (pIVar8 == (ImVec2 *)0x0) {
LAB_0014df86:
      pIVar8 = (ImVec2 *)0x0;
      pIVar5 = GImGui;
    }
    else {
      memcpy(pIVar4,pIVar8,(long)(this->_Path).Size << 3);
      pIVar5 = GImGui;
      pIVar8 = (this->_Path).Data;
      if (pIVar8 == (ImVec2 *)0x0) goto LAB_0014df86;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar5->IO).MemFreeFn)(pIVar8);
    (this->_Path).Data = pIVar4;
    (this->_Path).Capacity = iVar7;
    iVar3 = (this->_Path).Size;
    fVar10 = local_48;
  }
  else {
    pIVar4 = (this->_Path).Data;
  }
  (this->_Path).Size = iVar3 + 1;
  pIVar4[iVar3].x = fVar10;
  pIVar4[iVar3].y = fVar12;
  pIVar5 = GImGui;
  iVar3 = (this->_Path).Size;
  if (iVar3 == (this->_Path).Capacity) {
    if (iVar3 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar3 / 2 + iVar3;
    }
    iVar7 = iVar3 + 1;
    if (iVar3 + 1 < iVar6) {
      iVar7 = iVar6;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar4 = (ImVec2 *)(*(pIVar5->IO).MemAllocFn)((long)iVar7 << 3);
    pIVar8 = (this->_Path).Data;
    if (pIVar8 == (ImVec2 *)0x0) {
LAB_0014e02e:
      pIVar8 = (ImVec2 *)0x0;
      pIVar5 = GImGui;
    }
    else {
      memcpy(pIVar4,pIVar8,(long)(this->_Path).Size << 3);
      pIVar5 = GImGui;
      pIVar8 = (this->_Path).Data;
      if (pIVar8 == (ImVec2 *)0x0) goto LAB_0014e02e;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar5->IO).MemFreeFn)(pIVar8);
    (this->_Path).Data = pIVar4;
    (this->_Path).Capacity = iVar7;
    iVar3 = (this->_Path).Size;
  }
  else {
    pIVar4 = (this->_Path).Data;
  }
  (this->_Path).Size = iVar3 + 1;
  pIVar4[iVar3] = *b;
  pIVar5 = GImGui;
  fVar10 = a->x;
  fVar12 = b->y;
  iVar3 = (this->_Path).Size;
  if (iVar3 != (this->_Path).Capacity) {
    pIVar4 = (this->_Path).Data;
    goto LAB_0014e0ed;
  }
  if (iVar3 == 0) {
    iVar6 = 8;
  }
  else {
    iVar6 = iVar3 / 2 + iVar3;
  }
  iVar7 = iVar3 + 1;
  if (iVar3 + 1 < iVar6) {
    iVar7 = iVar6;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  pIVar4 = (ImVec2 *)(*(pIVar5->IO).MemAllocFn)((long)iVar7 << 3);
  pIVar8 = (this->_Path).Data;
  if (pIVar8 == (ImVec2 *)0x0) {
LAB_0014e0da:
    pIVar8 = (ImVec2 *)0x0;
    pIVar5 = GImGui;
  }
  else {
    memcpy(pIVar4,pIVar8,(long)(this->_Path).Size << 3);
    pIVar5 = GImGui;
    pIVar8 = (this->_Path).Data;
    if (pIVar8 == (ImVec2 *)0x0) goto LAB_0014e0da;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar5->IO).MemFreeFn)(pIVar8);
  (this->_Path).Data = pIVar4;
  (this->_Path).Capacity = iVar7;
  iVar3 = (this->_Path).Size;
LAB_0014e0ed:
  (this->_Path).Size = iVar3 + 1;
  pIVar4[iVar3].x = fVar10;
  pIVar4[iVar3].y = fVar12;
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, int rounding_corners)
{
    float r = rounding;
    r = ImMin(r, fabsf(b.x-a.x) * ( ((rounding_corners&(1|2))==(1|2)) || ((rounding_corners&(4|8))==(4|8)) ? 0.5f : 1.0f ) - 1.0f);
    r = ImMin(r, fabsf(b.y-a.y) * ( ((rounding_corners&(1|8))==(1|8)) || ((rounding_corners&(2|4))==(2|4)) ? 0.5f : 1.0f ) - 1.0f);

    if (r <= 0.0f || rounding_corners == 0)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x,a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x,b.y));
    }
    else
    {
        const float r0 = (rounding_corners & 1) ? r : 0.0f;
        const float r1 = (rounding_corners & 2) ? r : 0.0f;
        const float r2 = (rounding_corners & 4) ? r : 0.0f;
        const float r3 = (rounding_corners & 8) ? r : 0.0f;
        PathArcToFast(ImVec2(a.x+r0,a.y+r0), r0, 6, 9);
        PathArcToFast(ImVec2(b.x-r1,a.y+r1), r1, 9, 12);
        PathArcToFast(ImVec2(b.x-r2,b.y-r2), r2, 0, 3);
        PathArcToFast(ImVec2(a.x+r3,b.y-r3), r3, 3, 6);
    }
}